

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O0

Ivy_Obj_t * Ivy_ManFetchMemory(Ivy_Man_t *p)

{
  Ivy_Obj_t *__s;
  Ivy_Obj_t *pTemp;
  Ivy_Man_t *p_local;
  
  if (p->pListFree == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
  }
  __s = p->pListFree;
  p->pListFree = *(Ivy_Obj_t **)__s;
  memset(__s,0,0x50);
  return __s;
}

Assistant:

static inline Ivy_Obj_t * Ivy_ManFetchMemory( Ivy_Man_t * p )  
{ 
    Ivy_Obj_t * pTemp;
    if ( p->pListFree == NULL )
        Ivy_ManAddMemory( p );
    pTemp = p->pListFree;
    p->pListFree = *((Ivy_Obj_t **)pTemp);
    memset( pTemp, 0, sizeof(Ivy_Obj_t) ); 
    return pTemp;
}